

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::AsyncOutputStream,_std::nullptr_t> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapOutputFd
          (LowLevelAsyncIoProviderImpl *this,int fd,uint flags)

{
  AsyncOutputStream *extraout_RDX;
  undefined4 in_register_00000034;
  Own<kj::AsyncOutputStream,_std::nullptr_t> OVar1;
  Flags local_34;
  undefined1 local_30 [24];
  uint flags_local;
  int fd_local;
  LowLevelAsyncIoProviderImpl *this_local;
  
  _flags_local = (PromiseArena *)CONCAT44(in_register_00000034,fd);
  local_34 = OBSERVE_WRITE;
  local_30._20_4_ = flags;
  this_local = this;
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)local_30,*(UnixEventPort **)(_flags_local->bytes + 8),(int *)(local_30 + 0x14),
             (uint *)(local_30 + 0x10),&local_34);
  Own<kj::AsyncOutputStream,decltype(nullptr)>::Own<kj::(anonymous_namespace)::AsyncStreamFd,void>
            ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_30);
  Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::AsyncStreamFd,_std::nullptr_t> *)local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<AsyncOutputStream> wrapOutputFd(int fd, uint flags = 0) override {
    return heap<AsyncStreamFd>(eventPort, fd, flags, UnixEventPort::FdObserver::OBSERVE_WRITE);
  }